

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O3

double TestSpectra::B8_spectrum(double xMin,double xMax)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  RandomGen *pRVar4;
  initializer_list<double> __l;
  allocator_type local_79;
  double local_78;
  undefined8 uStack_70;
  vector<double,_std::allocator<double>_> local_68;
  vector<double,_std::allocator<double>_> local_48;
  double local_28;
  
  local_28 = (double)(-(ulong)(xMin == 0.0) & (ulong)xMin);
  local_78 = 4.0 - local_28;
  pRVar4 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar4);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(dVar1 * local_78 + local_28);
  pRVar4 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar4);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(dVar1 * 0.00633869711256927);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_48;
  std::vector<double,_std::allocator<double>_>::vector(&local_68,__l,&local_79);
  if (0.0 < local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2]) {
    do {
      dVar1 = *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78 = dVar1 * dVar1 * -0.32849 + dVar1 * 1.2184 + 2.198;
      uStack_70 = 0;
      dVar1 = pow(dVar1,3.0);
      local_78 = pow(10.0,-(local_78 + dVar1 * 0.12441));
      pRVar4 = RandomGen::rndm();
      RandomGen::VonNeumann
                (&local_48,pRVar4,local_28,4.0,0.0,0.00633869711256927,
                 *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],local_78);
      pdVar3 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar2 = local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar2 != (double *)0x0) {
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
    } while (0.0 < local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2]);
  }
  local_78 = *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return local_78;
}

Assistant:

double TestSpectra::B8_spectrum(double xMin, double xMax) {
  if (xMax != 4.) xMax = 4.;
  if (xMin != 0.) xMin = 0.;
  double yMax = pow(10., -2.198);
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = 2.198 + 1.2184 * xyTry[0] - 0.32849 * pow(xyTry[0], 2.) +
                       0.12441 * pow(xyTry[0], 3.);
    FuncValue = pow(10., -FuncValue);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}